

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_distributions.cc
# Opt level: O0

void discrete_dist_test_chi2_test<trng::uniform_int_dist>(uniform_int_dist *d)

{
  parameter_type P_00;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> __last;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> __last_00;
  StringRef capturedExpression;
  int iVar1;
  ExprLhs<bool> EVar2;
  result_type_conflict4 rVar3;
  result_type_conflict4 rVar4;
  size_type sVar5;
  int *piVar6;
  reference pvVar7;
  reference piVar8;
  reference pvVar9;
  AssertionHandler catchAssertionHandler;
  double c2_p;
  int count_old;
  double p_old;
  difference_type pos;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> min;
  int bin;
  result_type x;
  int i_1;
  lcg64_shift R;
  vector<int,_std::allocator<int>_> count;
  int N;
  int bins;
  double P;
  int i;
  vector<double,_std::allocator<double>_> p;
  undefined4 in_stack_fffffffffffffd78;
  Flags in_stack_fffffffffffffd7c;
  undefined4 in_stack_fffffffffffffd80;
  undefined2 in_stack_fffffffffffffd84;
  undefined1 in_stack_fffffffffffffd86;
  undefined1 in_stack_fffffffffffffd87;
  undefined1 uVar10;
  lcg64_shift *in_stack_fffffffffffffd88;
  SourceLineInfo *this;
  undefined4 in_stack_fffffffffffffd90;
  undefined4 uVar11;
  result_type_conflict4 in_stack_fffffffffffffd94;
  undefined4 uVar12;
  const_iterator in_stack_fffffffffffffd98;
  undefined4 in_stack_fffffffffffffda0;
  value_type in_stack_fffffffffffffda4;
  vector<int,_std::allocator<int>_> *in_stack_fffffffffffffda8;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> in_stack_fffffffffffffdb0;
  vector<int,_std::allocator<int>_> *in_stack_fffffffffffffdc8;
  vector<double,_std::allocator<double>_> *in_stack_fffffffffffffdd0;
  SourceLineInfo local_1c0;
  StringRef local_1b0;
  double local_158;
  int *local_150;
  int *local_148;
  int *local_140;
  int *local_138;
  int *local_130;
  int *local_128;
  int *local_120;
  double *local_110;
  double *local_108;
  double *local_100;
  value_type local_ec;
  uniform_int_dist *local_e8;
  int *local_e0;
  size_type local_d8;
  int *local_d0;
  int *local_c8;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_c0;
  int local_b8;
  int local_b4;
  int local_b0;
  int local_ac;
  undefined8 local_a8;
  undefined8 uStack_a0;
  undefined4 local_74;
  vector<int,_std::allocator<int>_> local_70;
  undefined4 local_58;
  int local_54;
  double local_50;
  double local_48;
  double local_40;
  int local_24;
  vector<double,_std::allocator<double>_> local_20;
  
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)0x385efc);
  for (local_24 = trng::uniform_int_dist::min((uniform_int_dist *)0x385f09); iVar1 = local_24,
      rVar3 = trng::uniform_int_dist::max((uniform_int_dist *)0x385f3b), iVar1 <= rVar3;
      local_24 = local_24 + 1) {
    local_40 = trng::uniform_int_dist::pdf
                         ((uniform_int_dist *)in_stack_fffffffffffffd88,
                          CONCAT13(in_stack_fffffffffffffd87,
                                   CONCAT12(in_stack_fffffffffffffd86,in_stack_fffffffffffffd84)));
    std::vector<double,_std::allocator<double>_>::push_back
              ((vector<double,_std::allocator<double>_> *)
               CONCAT17(in_stack_fffffffffffffd87,
                        CONCAT16(in_stack_fffffffffffffd86,
                                 CONCAT24(in_stack_fffffffffffffd84,in_stack_fffffffffffffd80))),
               (value_type_conflict6 *)CONCAT44(in_stack_fffffffffffffd7c,in_stack_fffffffffffffd78)
              );
    local_48 = trng::uniform_int_dist::cdf
                         ((uniform_int_dist *)in_stack_fffffffffffffd98._M_current,
                          in_stack_fffffffffffffd94);
    if (0.99 < local_48) break;
  }
  iVar1 = local_24;
  rVar3 = trng::uniform_int_dist::max((uniform_int_dist *)0x386022);
  if (iVar1 < rVar3) {
    local_50 = trng::uniform_int_dist::cdf
                         ((uniform_int_dist *)in_stack_fffffffffffffd98._M_current,
                          in_stack_fffffffffffffd94);
    local_50 = 1.0 - local_50;
    std::vector<double,_std::allocator<double>_>::push_back
              ((vector<double,_std::allocator<double>_> *)
               CONCAT17(in_stack_fffffffffffffd87,
                        CONCAT16(in_stack_fffffffffffffd86,
                                 CONCAT24(in_stack_fffffffffffffd84,in_stack_fffffffffffffd80))),
               (value_type_conflict6 *)CONCAT44(in_stack_fffffffffffffd7c,in_stack_fffffffffffffd78)
              );
  }
  sVar5 = std::vector<double,_std::allocator<double>_>::size(&local_20);
  local_54 = (int)sVar5;
  local_58 = 10000;
  local_74 = 0;
  std::allocator<int>::allocator((allocator<int> *)0x3860e2);
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)
             CONCAT44(in_stack_fffffffffffffda4,in_stack_fffffffffffffda0),
             (size_type)in_stack_fffffffffffffd98._M_current,
             (value_type_conflict3 *)CONCAT44(in_stack_fffffffffffffd94,in_stack_fffffffffffffd90),
             (allocator_type *)in_stack_fffffffffffffd88);
  std::allocator<int>::~allocator((allocator<int> *)0x386116);
  local_a8 = trng::lcg64_shift::Default;
  uStack_a0 = DAT_005526e8;
  P_00.b._0_4_ = in_stack_fffffffffffffd90;
  P_00.a = (result_type)in_stack_fffffffffffffd88;
  P_00.b._4_4_ = in_stack_fffffffffffffd94;
  trng::lcg64_shift::lcg64_shift
            ((lcg64_shift *)
             CONCAT17(in_stack_fffffffffffffd87,
                      CONCAT16(in_stack_fffffffffffffd86,
                               CONCAT24(in_stack_fffffffffffffd84,in_stack_fffffffffffffd80))),
             CONCAT44(in_stack_fffffffffffffd7c,in_stack_fffffffffffffd78),P_00);
  for (local_ac = 0; local_ac < 10000; local_ac = local_ac + 1) {
    rVar3 = trng::uniform_int_dist::operator()
                      ((uniform_int_dist *)
                       CONCAT44(in_stack_fffffffffffffd94,in_stack_fffffffffffffd90),
                       in_stack_fffffffffffffd88);
    rVar4 = trng::uniform_int_dist::min((uniform_int_dist *)0x386190);
    local_b0 = rVar3 - rVar4;
    local_b8 = local_54 + -1;
    piVar6 = Catch::clara::std::min<int>(&local_b0,&local_b8);
    local_b4 = *piVar6;
    pvVar7 = std::vector<int,_std::allocator<int>_>::operator[](&local_70,(long)local_b4);
    *pvVar7 = *pvVar7 + 1;
  }
  while (sVar5 = std::vector<double,_std::allocator<double>_>::size(&local_20), 2 < sVar5) {
    local_c8 = (int *)std::vector<int,_std::allocator<int>_>::begin
                                ((vector<int,_std::allocator<int>_> *)
                                 CONCAT44(in_stack_fffffffffffffd7c,in_stack_fffffffffffffd78));
    local_d0 = (int *)std::vector<int,_std::allocator<int>_>::end
                                ((vector<int,_std::allocator<int>_> *)
                                 CONCAT44(in_stack_fffffffffffffd7c,in_stack_fffffffffffffd78));
    __last._M_current._4_4_ = in_stack_fffffffffffffd94;
    __last._M_current._0_4_ = in_stack_fffffffffffffd90;
    local_c0 = std::
               min_element<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
                         ((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
                          in_stack_fffffffffffffd98._M_current,__last);
    piVar8 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator*
                       (&local_c0);
    if (8 < *piVar8) break;
    in_stack_fffffffffffffdc8 = &local_70;
    local_e0 = (int *)std::vector<int,_std::allocator<int>_>::begin
                                ((vector<int,_std::allocator<int>_> *)
                                 CONCAT44(in_stack_fffffffffffffd7c,in_stack_fffffffffffffd78));
    local_d8 = __gnu_cxx::operator-
                         ((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
                          CONCAT17(in_stack_fffffffffffffd87,
                                   CONCAT16(in_stack_fffffffffffffd86,
                                            CONCAT24(in_stack_fffffffffffffd84,
                                                     in_stack_fffffffffffffd80))),
                          (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
                          CONCAT44(in_stack_fffffffffffffd7c,in_stack_fffffffffffffd78));
    in_stack_fffffffffffffdd0 = &local_20;
    pvVar9 = std::vector<double,_std::allocator<double>_>::operator[]
                       (in_stack_fffffffffffffdd0,local_d8);
    local_e8 = (uniform_int_dist *)*pvVar9;
    pvVar7 = std::vector<int,_std::allocator<int>_>::operator[](in_stack_fffffffffffffdc8,local_d8);
    local_ec = *pvVar7;
    local_108 = (double *)
                std::vector<double,_std::allocator<double>_>::begin
                          ((vector<double,_std::allocator<double>_> *)
                           CONCAT44(in_stack_fffffffffffffd7c,in_stack_fffffffffffffd78));
    local_100 = (double *)
                __gnu_cxx::
                __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>::
                operator+((__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>
                           *)in_stack_fffffffffffffd88,
                          CONCAT17(in_stack_fffffffffffffd87,
                                   CONCAT16(in_stack_fffffffffffffd86,
                                            CONCAT24(in_stack_fffffffffffffd84,
                                                     in_stack_fffffffffffffd80))));
    __gnu_cxx::__normal_iterator<double_const*,std::vector<double,std::allocator<double>>>::
    __normal_iterator<double*>
              ((__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_> *)
               CONCAT17(in_stack_fffffffffffffd87,
                        CONCAT16(in_stack_fffffffffffffd86,
                                 CONCAT24(in_stack_fffffffffffffd84,in_stack_fffffffffffffd80))),
               (__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> *)
               CONCAT44(in_stack_fffffffffffffd7c,in_stack_fffffffffffffd78));
    local_110 = (double *)
                std::vector<double,_std::allocator<double>_>::erase
                          ((vector<double,_std::allocator<double>_> *)
                           CONCAT44(in_stack_fffffffffffffd94,in_stack_fffffffffffffd90),
                           in_stack_fffffffffffffd98);
    local_128 = (int *)std::vector<int,_std::allocator<int>_>::begin
                                 ((vector<int,_std::allocator<int>_> *)
                                  CONCAT44(in_stack_fffffffffffffd7c,in_stack_fffffffffffffd78));
    local_120 = (int *)__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>
                       ::operator+((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>
                                    *)in_stack_fffffffffffffd88,
                                   CONCAT17(in_stack_fffffffffffffd87,
                                            CONCAT16(in_stack_fffffffffffffd86,
                                                     CONCAT24(in_stack_fffffffffffffd84,
                                                              in_stack_fffffffffffffd80))));
    __gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>::
    __normal_iterator<int*>
              ((__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> *)
               CONCAT17(in_stack_fffffffffffffd87,
                        CONCAT16(in_stack_fffffffffffffd86,
                                 CONCAT24(in_stack_fffffffffffffd84,in_stack_fffffffffffffd80))),
               (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
               CONCAT44(in_stack_fffffffffffffd7c,in_stack_fffffffffffffd78));
    local_130 = (int *)std::vector<int,_std::allocator<int>_>::erase
                                 ((vector<int,_std::allocator<int>_> *)
                                  CONCAT44(in_stack_fffffffffffffd94,in_stack_fffffffffffffd90),
                                  (const_iterator)in_stack_fffffffffffffd98._M_current);
    in_stack_fffffffffffffda8 = &local_70;
    local_140 = (int *)std::vector<int,_std::allocator<int>_>::begin
                                 ((vector<int,_std::allocator<int>_> *)
                                  CONCAT44(in_stack_fffffffffffffd7c,in_stack_fffffffffffffd78));
    local_148 = (int *)std::vector<int,_std::allocator<int>_>::end
                                 ((vector<int,_std::allocator<int>_> *)
                                  CONCAT44(in_stack_fffffffffffffd7c,in_stack_fffffffffffffd78));
    __last_00._M_current._4_4_ = in_stack_fffffffffffffd94;
    __last_00._M_current._0_4_ = in_stack_fffffffffffffd90;
    in_stack_fffffffffffffdb0 =
         std::min_element<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
                   ((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
                    in_stack_fffffffffffffd98._M_current,__last_00);
    local_138 = in_stack_fffffffffffffdb0._M_current;
    local_c0 = in_stack_fffffffffffffdb0;
    local_150 = (int *)std::vector<int,_std::allocator<int>_>::begin
                                 ((vector<int,_std::allocator<int>_> *)
                                  CONCAT44(in_stack_fffffffffffffd7c,in_stack_fffffffffffffd78));
    local_d8 = __gnu_cxx::operator-
                         ((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
                          CONCAT17(in_stack_fffffffffffffd87,
                                   CONCAT16(in_stack_fffffffffffffd86,
                                            CONCAT24(in_stack_fffffffffffffd84,
                                                     in_stack_fffffffffffffd80))),
                          (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
                          CONCAT44(in_stack_fffffffffffffd7c,in_stack_fffffffffffffd78));
    in_stack_fffffffffffffd98._M_current = (double *)local_e8;
    pvVar9 = std::vector<double,_std::allocator<double>_>::operator[](&local_20,local_d8);
    *pvVar9 = (double)in_stack_fffffffffffffd98._M_current + *pvVar9;
    in_stack_fffffffffffffda4 = local_ec;
    pvVar7 = std::vector<int,_std::allocator<int>_>::operator[](&local_70,local_d8);
    *pvVar7 = in_stack_fffffffffffffda4 + *pvVar7;
  }
  local_158 = chi_percentil(in_stack_fffffffffffffdd0,in_stack_fffffffffffffdc8);
  uVar11 = SUB84(local_158,0);
  uVar12 = (undefined4)((ulong)local_158 >> 0x20);
  local_1b0 = operator____catch_sr
                        ((char *)CONCAT17(in_stack_fffffffffffffd87,
                                          CONCAT16(in_stack_fffffffffffffd86,
                                                   CONCAT24(in_stack_fffffffffffffd84,
                                                            in_stack_fffffffffffffd80))),
                         CONCAT44(in_stack_fffffffffffffd7c,in_stack_fffffffffffffd78));
  this = &local_1c0;
  Catch::SourceLineInfo::SourceLineInfo
            (this,
             "/workspace/llm4binary/github/license_c_cmakelists/rabauke[P]trng4/tests/test_distributions.cc"
             ,0x11c);
  Catch::StringRef::StringRef((StringRef *)CONCAT44(uVar12,uVar11),(char *)this);
  capturedExpression.m_size._0_4_ = in_stack_fffffffffffffda0;
  capturedExpression.m_start = (char *)in_stack_fffffffffffffd98._M_current;
  capturedExpression.m_size._4_4_ = in_stack_fffffffffffffda4;
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)CONCAT44(uVar12,uVar11),(StringRef *)this,
             (SourceLineInfo *)
             CONCAT17(in_stack_fffffffffffffd87,
                      CONCAT16(in_stack_fffffffffffffd86,
                               CONCAT24(in_stack_fffffffffffffd84,in_stack_fffffffffffffd80))),
             capturedExpression,in_stack_fffffffffffffd7c);
  uVar10 = 0.01 < local_158 && local_158 < 0.99;
  EVar2 = Catch::Decomposer::operator<=
                    ((Decomposer *)CONCAT44(in_stack_fffffffffffffd7c,in_stack_fffffffffffffd78),
                     false);
  Catch::AssertionHandler::handleExpr<bool>
            ((AssertionHandler *)in_stack_fffffffffffffdb0._M_current,
             (ExprLhs<bool> *)in_stack_fffffffffffffda8);
  Catch::AssertionHandler::complete
            ((AssertionHandler *)
             CONCAT17(uVar10,CONCAT16(EVar2.m_lhs,
                                      CONCAT24(in_stack_fffffffffffffd84,in_stack_fffffffffffffd80))
                     ));
  Catch::AssertionHandler::~AssertionHandler
            ((AssertionHandler *)
             CONCAT17(uVar10,CONCAT16(EVar2.m_lhs,
                                      CONCAT24(in_stack_fffffffffffffd84,in_stack_fffffffffffffd80))
                     ));
  std::vector<int,_std::allocator<int>_>::~vector
            ((vector<int,_std::allocator<int>_> *)CONCAT44(uVar12,uVar11));
  std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)CONCAT44(uVar12,uVar11));
  return;
}

Assistant:

void discrete_dist_test_chi2_test(dist &d) {
  using result_type = typename dist::result_type;
  std::vector<double> p;
  {
    int i{d.min()};
    while (i <= d.max()) {
      p.push_back(d.pdf(i));
      double P{d.cdf(i)};
      if (P > 0.99)
        break;
      ++i;
    }
    if (i < d.max())
      p.push_back(1.0 - d.cdf(i));
  }
  const int bins{static_cast<int>(p.size())};
  const int N{10000};
  std::vector<int> count(bins, 0);
  trng::lcg64_shift R(100ull);
  for (int i{0}; i < N; ++i) {
    const result_type x{d(R) - d.min()};
    int bin{std::min(x, bins - 1)};
    ++count[bin];
  }
  // merge bins with very small count numbers
  while (p.size() > 2) {
    auto min{std::min_element(count.begin(), count.end())};
    if (*min > 8)
      break;
    auto pos{min - count.begin()};
    const double p_old{p[pos]};
    const int count_old{count[pos]};
    p.erase(p.begin() + pos);
    count.erase(count.begin() + pos);
    min = std::min_element(count.begin(), count.end());
    pos = min - count.begin();
    p[pos] += p_old;
    count[pos] += count_old;
  }
  const double c2_p{chi_percentil(p, count)};
  REQUIRE((0.01 < c2_p and c2_p < 0.99));
}